

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O0

void bng_check_minmax(t_bng *x,int ftbreak,int fthold)

{
  int local_18;
  int h;
  int fthold_local;
  int ftbreak_local;
  t_bng *x_local;
  
  local_18 = fthold;
  h = ftbreak;
  if (fthold < ftbreak) {
    local_18 = ftbreak;
    h = fthold;
  }
  if (h < 10) {
    h = 10;
  }
  if (local_18 < 0x32) {
    local_18 = 0x32;
  }
  x->x_flashtime_break = h;
  x->x_flashtime_hold = local_18;
  return;
}

Assistant:

void bng_check_minmax(t_bng *x, int ftbreak, int fthold)
{
    if(ftbreak > fthold)
    {
        int h;

        h = ftbreak;
        ftbreak = fthold;
        fthold = h;
    }
    if(ftbreak < IEM_BNG_MINBREAKFLASHTIME)
        ftbreak = IEM_BNG_MINBREAKFLASHTIME;
    if(fthold < IEM_BNG_MINHOLDFLASHTIME)
        fthold = IEM_BNG_MINHOLDFLASHTIME;
    x->x_flashtime_break = ftbreak;
    x->x_flashtime_hold = fthold;
}